

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

void DumpAnchors(path *anchors_db_path,vector<CAddress,_std::allocator<CAddress>_> *anchors)

{
  long lVar1;
  string prefix;
  path src;
  string end_msg;
  path dest;
  bool bVar2;
  uint64_t uVar3;
  FILE *file;
  CChainParams *pCVar4;
  char *__stream;
  FILE *__stream_00;
  int source_line;
  unsigned_short *args_1;
  LogFlags in_R9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  Level in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined8 in_stack_fffffffffffffdb0;
  SerParams *fmt;
  undefined8 in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  pointer in_stack_fffffffffffffdc8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var5;
  pointer in_stack_fffffffffffffdd0;
  pointer pbVar6;
  pointer in_stack_fffffffffffffdd8;
  pointer pbVar7;
  FILE *in_stack_fffffffffffffde0;
  pointer pbVar8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var9;
  uint16_t randv;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer6;
  path local_138;
  path local_110;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"DumpAnchors",(allocator<char> *)&pathTmp);
  hashwriter.super_HashWriter.ctx.s._0_8_ =
       ((long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
             super__Vector_impl_data._M_start) / 0x38;
  tinyformat::format<unsigned_long>
            (&local_1d8,"Flush %d outbound block-relay-only peer addresses to anchors.dat",
             (unsigned_long *)&hashwriter);
  args_1 = (unsigned_short *)&DAT_00000001;
  prefix._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
  prefix._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffda8;
  prefix._M_string_length = in_stack_fffffffffffffdb0;
  prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffdb8;
  prefix.field_2._8_8_ = in_stack_fffffffffffffdc0;
  end_msg._M_string_length = (size_type)in_stack_fffffffffffffdd0;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8;
  end_msg.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffdd8;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffde0;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
            (&logging_timer6,prefix,end_msg,(LogFlags)local_1b8,SUB81(&local_1d8,0));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"anchors",(allocator<char> *)&stack0xfffffffffffffdc7);
  fmt = &CAddress::V2_DISK;
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashwriter,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<16>
                    ((RandomMixin<FastRandomContext> *)&hashwriter);
  ChaCha20::~ChaCha20((ChaCha20 *)(hashwriter.super_HashWriter.ctx.s + 4));
  randv = (uint16_t)uVar3;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&tmpfn,(tinyformat *)"%s.%04x",(char *)local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&randv,args_1);
  source_line = (int)args_1;
  ArgsManager::GetDataDirNet((path *)&local_110,&gArgs);
  fs::u8path((path *)&hashwriter,&tmpfn);
  fs::operator/(&pathTmp,(path *)&local_110,(path *)&hashwriter);
  std::filesystem::__cxx11::path::~path((path *)&hashwriter);
  std::filesystem::__cxx11::path::~path(&local_110);
  __stream = "wb";
  file = fsbridge::fopen((char *)&pathTmp,"wb");
  pbVar8 = (pointer)0x0;
  _Var9._M_head_impl = (_Impl *)0x0;
  _Var5._M_head_impl = (_Impl *)0x0;
  pbVar6 = (pointer)0x0;
  pbVar7 = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffdc8);
  if (file == (FILE *)0x0) {
    AutoFile::fclose((AutoFile *)&stack0xfffffffffffffde0,(FILE *)__stream);
    std::filesystem::remove((path *)&pathTmp);
    std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_00._M_len = 0x53;
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    LogPrintf_<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,
               IPC|I2P|QT|LIBEVENT|CMPCTBLOCK|RPC|WALLETDB|BENCH|HTTP|NET,(Level)&hashwriter,
               (char *)fmt,(char (*) [16])anchors,in_stack_fffffffffffffdc0);
  }
  else {
    HashedSourceWriter<AutoFile>::HashedSourceWriter
              (&hashwriter,(AutoFile *)&stack0xfffffffffffffde0);
    pCVar4 = Params();
    Serialize<HashedSourceWriter<AutoFile>,_unsigned_char,_4UL>
              (&hashwriter,&pCVar4->pchMessageStart);
    ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>::
    Serialize<HashedSourceWriter<AutoFile>>
              ((ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>
                *)&stack0xfffffffffffffdb0,&hashwriter);
    HashWriter::GetHash((uint256 *)&local_138,&hashwriter.super_HashWriter);
    __stream_00 = (FILE *)&stack0xfffffffffffffde0;
    base_blob<256U>::Serialize<AutoFile>((base_blob<256U> *)&local_138,(AutoFile *)__stream_00);
    bVar2 = FileCommit((FILE *)file);
    if (bVar2) {
      AutoFile::fclose((AutoFile *)&stack0xfffffffffffffde0,__stream_00);
      std::filesystem::__cxx11::path::path((path *)&hashwriter,&pathTmp.super_path);
      std::filesystem::__cxx11::path::path(&local_138,&anchors_db_path->super_path);
      src.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
      src.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffda8;
      src.super_path._M_pathname._M_string_length = (size_type)fmt;
      src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)anchors;
      src.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffdc0;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )_Var5._M_head_impl;
      dest.super_path._M_pathname._M_string_length = (size_type)pbVar7;
      dest.super_path._M_pathname._M_dataplus._M_p = (pointer)pbVar6;
      dest.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)file;
      dest.super_path._M_pathname.field_2._8_8_ = pbVar8;
      dest.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )_Var9._M_head_impl;
      bVar2 = RenameOver(src,dest);
      std::filesystem::__cxx11::path::~path(&local_138);
      std::filesystem::__cxx11::path::~path((path *)&hashwriter);
      if (!bVar2) {
        std::filesystem::remove((path *)&pathTmp);
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
        source_file._M_len = 0x53;
        logging_function._M_str = "SerializeFileDB";
        logging_function._M_len = 0xf;
        LogPrintf_<char[16]>
                  (logging_function,source_file,source_line,in_R9,in_stack_fffffffffffffda8,
                   (char *)fmt,(char (*) [16])anchors);
      }
      goto LAB_006a2612;
    }
    AutoFile::fclose((AutoFile *)&stack0xfffffffffffffde0,__stream_00);
    std::filesystem::remove((path *)&pathTmp);
    std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_01._M_len = 0x53;
    logging_function_01._M_str = "SerializeFileDB";
    logging_function_01._M_len = 0xf;
    LogPrintf_<char[16],std::__cxx11::string>
              (logging_function_01,source_file_01,0x4f,
               IPC|I2P|QT|LIBEVENT|CMPCTBLOCK|RPC|WALLETDB|ZMQ|BENCH|MEMPOOL|NET,(Level)&hashwriter,
               (char *)fmt,(char (*) [16])anchors,in_stack_fffffffffffffdc0);
  }
  std::__cxx11::string::~string((string *)&hashwriter);
LAB_006a2612:
  AutoFile::~AutoFile((AutoFile *)&stack0xfffffffffffffde0);
  std::filesystem::__cxx11::path::~path(&pathTmp.super_path);
  std::__cxx11::string::~string((string *)&tmpfn);
  std::__cxx11::string::~string(local_1f8);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(&logging_timer6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DumpAnchors(const fs::path& anchors_db_path, const std::vector<CAddress>& anchors)
{
    LOG_TIME_SECONDS(strprintf("Flush %d outbound block-relay-only peer addresses to anchors.dat", anchors.size()));
    SerializeFileDB("anchors", anchors_db_path, CAddress::V2_DISK(anchors));
}